

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexDecomposition.cpp
# Opt level: O2

void ConvexDecomposition::addTri
               (VertexLookup vl,UintVector *list,Vector3d *p1,Vector3d *p2,Vector3d *p3)

{
  uint uVar1;
  uint uVar2;
  uint i3;
  uint i2;
  uint i1;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  uVar1 = Vl_getIndex(vl,&p1->x);
  local_2c = uVar1;
  uVar2 = Vl_getIndex(vl,&p2->x);
  local_30 = uVar2;
  local_34 = Vl_getIndex(vl,&p3->x);
  if (((uVar2 != local_34) && (uVar1 != local_34)) && (uVar1 != uVar2)) {
    cbtAlignedObjectArray<unsigned_int>::push_back(list,&local_2c);
    cbtAlignedObjectArray<unsigned_int>::push_back(list,&local_30);
    cbtAlignedObjectArray<unsigned_int>::push_back(list,&local_34);
  }
  return;
}

Assistant:

void addTri(VertexLookup vl,UintVector &list,const Vector3d &p1,const Vector3d &p2,const Vector3d &p3)
{
  unsigned int i1 = Vl_getIndex(vl, p1.Ptr() );
  unsigned int i2 = Vl_getIndex(vl, p2.Ptr() );
  unsigned int i3 = Vl_getIndex(vl, p3.Ptr() );

  // do *not* process degenerate triangles!

  if ( i1 != i2 && i1 != i3 && i2 != i3 )
  {
    list.push_back(i1);
    list.push_back(i2);
    list.push_back(i3);
  }
}